

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O0

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextToken(Lexer *this)

{
  bool bVar1;
  int iVar2;
  int_type iVar3;
  char *pcVar4;
  Lexer *in_RSI;
  Position local_50;
  Position local_38;
  undefined1 local_20 [8];
  unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> result;
  Lexer *this_local;
  
  skipSpace(in_RSI);
  in_RSI->currentStartIndex = in_RSI->currentEndIndex;
  iVar2 = isalpha(in_RSI->currentChar);
  if ((iVar2 == 0) && (in_RSI->currentChar != 0x5f)) {
    bVar1 = _isNewLineCharacter((char)in_RSI->currentChar);
    if (bVar1) {
      nextTokenLine(this);
    }
    else {
      pcVar4 = strchr(")]}",in_RSI->currentChar);
      if (pcVar4 == (char *)0x0) {
        if (in_RSI->currentChar == 0x22) {
          nextTokenString(this);
        }
        else if (in_RSI->currentChar == 0x27) {
          nextTokenChar(this);
        }
        else {
          iVar2 = isdigit(in_RSI->currentChar);
          if (iVar2 == 0) {
            nextTokenOperator((Lexer *)local_20);
            bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_20);
            if (bVar1) {
              std::unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_>::unique_ptr
                        ((unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> *)this,
                         (unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> *)
                         local_20);
            }
            else if (in_RSI->currentChar == 0x23) {
              nextTokenCapability(this);
            }
            else {
              iVar2 = in_RSI->currentChar;
              iVar3 = std::char_traits<char>::eof();
              if (iVar2 == iVar3) {
                nextTokenEOF(this);
              }
              else {
                local_38.line._6_2_ = 2;
                local_38.line._0_4_ = 0;
                getCurrentCursor(&local_50,in_RSI);
                std::
                make_unique<pfederc::Error<pfederc::LexerErrorCode>,pfederc::Level,pfederc::LexerErrorCode,pfederc::Position>
                          ((Level *)&local_38.startIndex,
                           (LexerErrorCode *)((long)&local_38.line + 6),&local_38);
                generateError(this,(unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                                    *)in_RSI);
                std::
                unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                               *)&local_38.startIndex);
              }
            }
            local_38.endIndex._4_4_ = 1;
            std::unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_>::~unique_ptr
                      ((unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> *)local_20)
            ;
          }
          else {
            nextTokenNum(this);
          }
        }
      }
      else {
        nextTokenBracket(this);
      }
    }
  }
  else {
    nextTokenId(this);
  }
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextToken() noexcept {
  // Ignore spaces
  skipSpace();
  // set token starting point
  currentStartIndex = currentEndIndex;

  if (std::isalpha(currentChar) || currentChar == '_')
    return nextTokenId();

  if (_isNewLineCharacter(currentChar))
    return nextTokenLine();

  if (std::strchr(")]}", currentChar))
    return nextTokenBracket();

  if (currentChar == '"')
    return nextTokenString();

  if (currentChar == '\'')
    return nextTokenChar();

  if (std::isdigit(currentChar))
    return nextTokenNum();

  std::unique_ptr<Token> result(nextTokenOperator());
  if (result)
    return result;

  if (currentChar == '#')
    return nextTokenCapability();

  if (currentChar == std::char_traits<char>::eof())
    return nextTokenEOF();

  return generateError(std::make_unique<LexerError>(LVL_ERROR,
      LexerErrorCode::LEX_ERR_GENERAL_INVALID_CHARACTER,
      getCurrentCursor()));
}